

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  UnknownField *this_00;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  anon_union_8_5_912831f5_for_data_ aVar2;
  uint32 uVar3;
  pointer pUVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  pvVar1 = this->fields_;
  if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    pUVar4 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar1->
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        )._M_impl.super__Vector_impl_data._M_finish == pUVar4) {
      std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
      resize(pvVar1,0);
    }
    else {
      lVar6 = 0;
      uVar7 = 0;
      uVar5 = 0;
      do {
        this_00 = (UnknownField *)((long)&pUVar4->number_ + lVar6);
        if (*(int *)((long)&pUVar4->number_ + lVar6) == number) {
          UnknownField::Delete(this_00);
        }
        else {
          if (uVar7 != uVar5) {
            uVar3 = this_00->type_;
            aVar2 = this_00->data_;
            pUVar4 = pUVar4 + (int)uVar5;
            pUVar4->number_ = this_00->number_;
            pUVar4->type_ = uVar3;
            pUVar4->data_ = aVar2;
          }
          uVar5 = (ulong)((int)uVar5 + 1);
        }
        uVar7 = uVar7 + 1;
        pvVar1 = this->fields_;
        pUVar4 = (pvVar1->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < (ulong)((long)(pvVar1->
                                     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 4
                              ));
      std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
      resize(pvVar1,(long)(int)uVar5);
      if ((int)uVar5 != 0) {
        return;
      }
    }
    pvVar1 = this->fields_;
    if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    *)0x0) &&
       (pUVar4 = (pvVar1->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_start, pUVar4 != (pointer)0x0)) {
      operator_delete(pUVar4,(long)(pvVar1->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)pUVar4);
    }
    operator_delete(pvVar1,0x18);
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  if (fields_ == NULL) return;
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_->size(); ++i) {
    UnknownField* field = &(*fields_)[i];
    if (field->number() == number) {
      field->Delete();
    } else {
      if (i != left) {
        (*fields_)[left] = (*fields_)[i];
      }
      ++left;
    }
  }
  fields_->resize(left);
  if (left == 0) {
    // maintain invariant: never hold fields_ if empty.
    delete fields_;
    fields_ = NULL;
  }
}